

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O0

void coda_type_release(coda_type *type)

{
  coda_type *type_local;
  
  if (type != (coda_type *)0x0) {
    if (type->retain_count < 1) {
      switch(type->type_class) {
      case coda_record_class:
        record_delete((coda_type_record *)type);
        break;
      case coda_array_class:
        array_delete((coda_type_array *)type);
        break;
      case coda_integer_class:
      case coda_real_class:
        number_delete((coda_type_number *)type);
        break;
      case coda_text_class:
        text_delete((coda_type_text *)type);
        break;
      case coda_raw_class:
        raw_delete((coda_type_raw *)type);
        break;
      case coda_special_class:
        special_delete((coda_type_special *)type);
      }
    }
    else {
      type->retain_count = type->retain_count + -1;
    }
  }
  return;
}

Assistant:

void coda_type_release(coda_type *type)
{
    if (type == NULL)
    {
        return;
    }

    if (type->retain_count > 0)
    {
        type->retain_count--;
        return;
    }

    switch (type->type_class)
    {
        case coda_record_class:
            record_delete((coda_type_record *)type);
            break;
        case coda_array_class:
            array_delete((coda_type_array *)type);
            break;
        case coda_integer_class:
        case coda_real_class:
            number_delete((coda_type_number *)type);
            break;
        case coda_text_class:
            text_delete((coda_type_text *)type);
            break;
        case coda_raw_class:
            raw_delete((coda_type_raw *)type);
            break;
        case coda_special_class:
            special_delete((coda_type_special *)type);
            break;
    }
}